

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rterror.cpp
# Opt level: O0

char16 * LoadResourceStr(UINT id)

{
  void *pvVar1;
  char16 *local_30;
  void *p;
  _ResourceStr key;
  UINT id_local;
  
  key.str._4_4_ = id;
  if (!s_resourceStrsSorted) {
    qsort(s_resourceStrs,0x2a8,0x10,compare_ResourceStr);
    s_resourceStrsSorted = true;
  }
  p._0_4_ = key.str._4_4_;
  key.id = 0;
  key._4_4_ = 0;
  pvVar1 = PAL_bsearch(&p,s_resourceStrs,0x2a8,0x10,compare_ResourceStr);
  if (pvVar1 == (void *)0x0) {
    local_30 = (char16 *)0x0;
  }
  else {
    local_30 = *(char16 **)((long)pvVar1 + 8);
  }
  return local_30;
}

Assistant:

const char16* LoadResourceStr(UINT id)
{
    if (!s_resourceStrsSorted)
    {
        qsort(s_resourceStrs,
            _countof(s_resourceStrs), sizeof(s_resourceStrs[0]),
            compare_ResourceStr);
        s_resourceStrsSorted = true;
    }

    _ResourceStr key = { id, nullptr };
    const void* p = bsearch(&key,
        s_resourceStrs, _countof(s_resourceStrs), sizeof(s_resourceStrs[0]),
        compare_ResourceStr);

    return p ? reinterpret_cast<const _ResourceStr*>(p)->str : nullptr;
}